

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

void __thiscall
Fl_Tree_Item::draw_vertical_connector(Fl_Tree_Item *this,int x,int y1,int y2,Fl_Tree_Prefs *prefs)

{
  Fl_Color c;
  Fl_Tree_Connector FVar1;
  uint local_2c;
  int yy;
  Fl_Tree_Prefs *prefs_local;
  int y2_local;
  int y1_local;
  int x_local;
  Fl_Tree_Item *this_local;
  
  c = Fl_Tree_Prefs::connectorcolor(prefs);
  fl_color(c);
  FVar1 = Fl_Tree_Prefs::connectorstyle(prefs);
  if (FVar1 != FL_TREE_CONNECTOR_NONE) {
    if (FVar1 == FL_TREE_CONNECTOR_DOTTED) {
      for (local_2c = y1 | 1; (int)local_2c <= (int)(y2 | 1U); local_2c = local_2c + 2) {
        fl_point(x,local_2c);
      }
    }
    else if (FVar1 == FL_TREE_CONNECTOR_SOLID) {
      fl_line(x,y1 | 1,x,y2 | 1);
    }
  }
  return;
}

Assistant:

void Fl_Tree_Item::draw_vertical_connector(int x, int y1, int y2, const Fl_Tree_Prefs &prefs) {
  fl_color(prefs.connectorcolor());
  switch ( prefs.connectorstyle() ) {
    case FL_TREE_CONNECTOR_SOLID:
      y1 |= 1;				// force alignment w/dot pattern
      y2 |= 1;				// force alignment w/dot pattern
      fl_line(x,y1,x,y2);
      return;
    case FL_TREE_CONNECTOR_DOTTED:
    {
      y1 |= 1;				// force alignment w/dot pattern
      y2 |= 1;				// force alignment w/dot pattern
      for ( int yy=y1; yy<=y2; yy+=2 ) {
        fl_point(x, yy);
      }
      return;
    }
    case FL_TREE_CONNECTOR_NONE:
      return;
  }
}